

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

compare_eq_result_container<QList<QPointF>,_QPointF> __thiscall
QList<QPointF>::operator==(QList<QPointF> *this,QList<QPointF> *other)

{
  long lVar1;
  bool bVar2;
  QPointF *p1;
  QPointF *p2;
  long lVar3;
  
  lVar3 = (this->d).size;
  lVar1 = (other->d).size;
  if (lVar3 == lVar1) {
    p1 = (this->d).ptr;
    p2 = (other->d).ptr;
    if (p1 == p2) {
      return true;
    }
    if (lVar3 == lVar1) {
      if (lVar3 == 0) {
        return lVar3 == 0;
      }
      bVar2 = qFuzzyCompare(p1,p2);
      if (bVar2) {
        lVar3 = lVar3 << 4;
        do {
          lVar3 = lVar3 + -0x10;
          p2 = p2 + 1;
          p1 = p1 + 1;
          if (lVar3 == 0) {
            return lVar3 == 0;
          }
          bVar2 = qFuzzyCompare(p1,p2);
        } while (bVar2);
        return false;
      }
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }